

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

string * __thiscall
slang::ast::TypeArgFormatter::format_abi_cxx11_
          (string *__return_storage_ptr__,TypeArgFormatter *this,any *arg)

{
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Type_*,_const_slang::ast::Type_*,_slang::Hasher<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Type_*>_>,_std::equal_to<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Type_*>_>,_std::allocator<const_slang::ast::Type_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>_>::templated_iterator<const_slang::ast::Type_*>,_bool>
  pVar1;
  Type *local_48;
  EntryPointer local_40;
  byte local_38;
  byte local_29;
  Type *pTStack_28;
  bool unique;
  Type *type;
  any *arg_local;
  TypeArgFormatter *this_local;
  
  type = (Type *)arg;
  arg_local = (any *)this;
  this_local = (TypeArgFormatter *)__return_storage_ptr__;
  local_48 = std::any_cast<slang::ast::Type_const*>(arg);
  pTStack_28 = local_48;
  pVar1 = ska::detailv3::
          sherwood_v3_table<const_slang::ast::Type_*,_const_slang::ast::Type_*,_slang::Hasher<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Type_*>_>,_std::equal_to<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Type_*>_>,_std::allocator<const_slang::ast::Type_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>_>
          ::insert(&(this->seenTypes).
                    super_sherwood_v3_table<const_slang::ast::Type_*,_const_slang::ast::Type_*,_slang::Hasher<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Type_*>_>,_std::equal_to<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Type_*>_>,_std::allocator<const_slang::ast::Type_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>_>
                   ,&local_48);
  local_40 = (EntryPointer)pVar1.first.current;
  local_38 = pVar1.second;
  local_29 = local_38 & 1;
  (this->printer).options.printAKA = (bool)local_29;
  TypePrinter::clear(&this->printer);
  TypePrinter::append(&this->printer,pTStack_28);
  TypePrinter::toString_abi_cxx11_(__return_storage_ptr__,&this->printer);
  return __return_storage_ptr__;
}

Assistant:

std::string TypeArgFormatter::format(const std::any& arg) {
    const Type& type = *std::any_cast<const Type*>(arg);
    bool unique = seenTypes.insert(&type).second;
    printer.options.printAKA = unique;

    printer.clear();
    printer.append(type);
    return printer.toString();
}